

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86.cpp
# Opt level: O3

int __thiscall
ncnn::HardSwish_x86::forward_inplace(HardSwish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  int iVar11;
  float fVar12;
  undefined1 auVar13 [16];
  
  auVar5 = _DAT_00517e50;
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    pp_Var3 = this->_vptr_HardSwish_x86;
    lVar9 = 0;
    do {
      pfVar10 = (float *)(bottom_top_blob->cstep * lVar9 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      if ((int)uVar6 < 4) {
        uVar7 = 0;
      }
      else {
        iVar11 = 3;
        do {
          p_Var4 = pp_Var3[-3];
          fVar1 = *(float *)(&this->field_0xd0 + (long)p_Var4);
          fVar12 = *(float *)(&this->field_0xd4 + (long)p_Var4);
          auVar13._0_4_ = fVar1 * *pfVar10 + fVar12;
          auVar13._4_4_ = fVar1 * pfVar10[1] + fVar12;
          auVar13._8_4_ = fVar1 * pfVar10[2] + fVar12;
          auVar13._12_4_ = fVar1 * pfVar10[3] + fVar12;
          auVar13 = maxps(auVar13,ZEXT816(0));
          auVar13 = minps(auVar13,auVar5);
          *pfVar10 = auVar13._0_4_ * *pfVar10;
          pfVar10[1] = auVar13._4_4_ * pfVar10[1];
          pfVar10[2] = auVar13._8_4_ * pfVar10[2];
          pfVar10[3] = auVar13._12_4_ * pfVar10[3];
          pfVar10 = pfVar10 + 4;
          iVar11 = iVar11 + 4;
          uVar7 = uVar6 & 0xfffffffc;
        } while (iVar11 < (int)uVar6);
      }
      if (uVar6 - uVar7 != 0 && (int)uVar7 <= (int)uVar6) {
        lVar8 = 0;
        do {
          fVar1 = pfVar10[lVar8];
          p_Var4 = pp_Var3[-3];
          fVar12 = 0.0;
          if (fVar1 < *(float *)(&this->field_0xd8 + (long)p_Var4)) {
LAB_004db873:
            pfVar10[lVar8] = fVar12;
          }
          else if (fVar1 < *(float *)(&this->field_0xdc + (long)p_Var4) ||
                   fVar1 == *(float *)(&this->field_0xdc + (long)p_Var4)) {
            fVar12 = (*(float *)(&this->field_0xd0 + (long)p_Var4) * fVar1 +
                     *(float *)(&this->field_0xd4 + (long)p_Var4)) * fVar1;
            goto LAB_004db873;
          }
          lVar8 = lVar8 + 1;
        } while (uVar6 - uVar7 != (int)lVar8);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar2);
  }
  return 0;
}

Assistant:

int HardSwish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}